

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O2

int SUNHashMap_GetValue(SUNHashMap map,char *key,void **value)

{
  int iVar1;
  uint64_t uVar2;
  int iVar3;
  SUNHashMapKeyValue pSVar4;
  
  iVar3 = -1;
  if (value != (void **)0x0 && (key != (char *)0x0 && map != (SUNHashMap)0x0)) {
    uVar2 = fnv1a_hash(key);
    iVar3 = (int)(uVar2 % (ulong)(long)map->max_size);
    pSVar4 = map->buckets[iVar3];
    if (pSVar4 == (SUNHashMapKeyValue)0x0) {
      iVar3 = -2;
    }
    else {
      iVar1 = strcmp(pSVar4->key,key);
      if (iVar1 != 0) {
        iVar1 = SUNHashMap_Iterate(map,iVar3 + 1,sunHashMapLinearProbeGet,key);
        if (iVar1 < 0) {
          return -1;
        }
        if (iVar1 == map->max_size) {
          return -2;
        }
        pSVar4 = map->buckets[iVar3];
      }
      *value = pSVar4->value;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int SUNHashMap_GetValue(SUNHashMap map, const char* key, void** value)
{
  int idx;
  int retval;

  if (map == NULL || key == NULL || value == NULL) { return (-1); }

  /* We want the index to be in (0, map->max_size) */
  idx = (int)(fnv1a_hash(key) % map->max_size);

  /* Check if the key exists */
  if (map->buckets[idx] == NULL) { return (-2); }

  /* Check to see if this is a collision */
  if (strcmp(map->buckets[idx]->key, key))
  {
    /* Keys did not match, so we have a collision and need to probe */
    retval = SUNHashMap_Iterate(map, idx + 1, sunHashMapLinearProbeGet, key);
    if (retval < 0) { return (-1); /* error occurred */ }
    if (retval == map->max_size) { return (-2); /* not found */ }
  }

  /* Return a reference to the value only */
  *value = map->buckets[idx]->value;

  return (0);
}